

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O3

void icetComposite(IceTImage destBuffer,IceTImage srcBuffer,int srcOnTop)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  IceTFloat *pIVar4;
  IceTFloat *pIVar5;
  IceTUByte *pIVar6;
  IceTUByte *pIVar7;
  IceTUInt *pIVar8;
  IceTUInt *pIVar9;
  IceTFloat *pIVar10;
  IceTFloat *pIVar11;
  ulong uVar12;
  IceTBitField level;
  long lVar13;
  int iVar14;
  IceTEnum type;
  char *pcVar15;
  int iVar16;
  uint uVar17;
  float fVar18;
  float fVar19;
  IceTEnum composite_mode;
  IceTEnum local_34;
  
  uVar2 = 0;
  uVar17 = 0;
  if (destBuffer.opaque_internals != (IceTVoid *)0x0) {
    uVar17 = *(int *)((long)destBuffer.opaque_internals + 0x10) *
             *(int *)((long)destBuffer.opaque_internals + 0xc);
  }
  if (srcBuffer.opaque_internals != (IceTVoid *)0x0) {
    uVar2 = *(int *)((long)srcBuffer.opaque_internals + 0x10) *
            *(int *)((long)srcBuffer.opaque_internals + 0xc);
  }
  if (uVar17 != uVar2) {
    pcVar15 = "Source and destination sizes don\'t match.";
    iVar16 = 0x7e1;
    goto LAB_00113847;
  }
  if (destBuffer.opaque_internals == (IceTVoid *)0x0) {
    iVar14 = 0xd000;
    iVar16 = 0xc000;
    if (srcBuffer.opaque_internals == (IceTVoid *)0x0) {
LAB_0011376f:
      local_34 = (IceTEnum)((ulong)in_RAX >> 0x20);
      icetGetEnumv(0x28,&local_34);
      icetTimingBlendBegin();
      if (local_34 == 0x302) {
        if (iVar14 != 0xd000) {
          icetRaiseDiagnostic("Z buffer ignored during blend composite operation.  Output z buffer meaningless."
                              ,0xfffffffa,3,
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                              ,0x822);
        }
        if (iVar16 == 0xc000) {
          pcVar15 = "Compositing image with no data.";
          type = 0xfffffffb;
          level = 3;
          iVar16 = 0x842;
        }
        else {
          if (iVar16 == 0xc002) {
            pIVar4 = icetImageGetColorcf(srcBuffer);
            pIVar5 = icetImageGetColorf(destBuffer);
            if (srcOnTop == 0) {
              if (0 < (int)uVar17) {
                lVar13 = 0;
                do {
                  fVar18 = *(float *)((long)pIVar5 + lVar13 + 0xc);
                  fVar19 = 1.0 - fVar18;
                  *(float *)((long)pIVar5 + lVar13) =
                       *(float *)((long)pIVar4 + lVar13) * fVar19 +
                       *(float *)((long)pIVar5 + lVar13);
                  *(float *)((long)pIVar5 + lVar13 + 4) =
                       *(float *)((long)pIVar4 + lVar13 + 4) * fVar19 +
                       *(float *)((long)pIVar5 + lVar13 + 4);
                  *(float *)((long)pIVar5 + lVar13 + 8) =
                       *(float *)((long)pIVar4 + lVar13 + 8) * fVar19 +
                       *(float *)((long)pIVar5 + lVar13 + 8);
                  *(float *)((long)pIVar5 + lVar13 + 0xc) =
                       fVar19 * *(float *)((long)pIVar4 + lVar13 + 0xc) + fVar18;
                  lVar13 = lVar13 + 0x10;
                } while ((ulong)uVar17 << 4 != lVar13);
              }
            }
            else if (0 < (int)uVar17) {
              lVar13 = 0;
              do {
                fVar18 = 1.0 - *(float *)((long)pIVar4 + lVar13 + 0xc);
                *(float *)((long)pIVar5 + lVar13) =
                     *(float *)((long)pIVar5 + lVar13) * fVar18 + *(float *)((long)pIVar4 + lVar13);
                *(float *)((long)pIVar5 + lVar13 + 4) =
                     *(float *)((long)pIVar5 + lVar13 + 4) * fVar18 +
                     *(float *)((long)pIVar4 + lVar13 + 4);
                *(float *)((long)pIVar5 + lVar13 + 8) =
                     *(float *)((long)pIVar5 + lVar13 + 8) * fVar18 +
                     *(float *)((long)pIVar4 + lVar13 + 8);
                *(float *)((long)pIVar5 + lVar13 + 0xc) =
                     fVar18 * *(float *)((long)pIVar5 + lVar13 + 0xc) +
                     *(float *)((long)pIVar4 + lVar13 + 0xc);
                lVar13 = lVar13 + 0x10;
              } while ((ulong)uVar17 << 4 != lVar13);
            }
            goto LAB_00113cac;
          }
          if (iVar16 == 0xc001) {
            pIVar6 = icetImageGetColorcub(srcBuffer);
            pIVar7 = icetImageGetColorub(destBuffer);
            if (srcOnTop == 0) {
              if (0 < (int)uVar17) {
                uVar12 = 0;
                do {
                  bVar1 = pIVar7[uVar12 * 4 + 3];
                  uVar2 = bVar1 ^ 0xff;
                  pIVar7[uVar12 * 4] =
                       pIVar7[uVar12 * 4] + (char)((pIVar6[uVar12 * 4] * uVar2) / 0xff);
                  pIVar7[uVar12 * 4 + 1] =
                       pIVar7[uVar12 * 4 + 1] + (char)((pIVar6[uVar12 * 4 + 1] * uVar2) / 0xff);
                  pIVar7[uVar12 * 4 + 2] =
                       pIVar7[uVar12 * 4 + 2] + (char)((pIVar6[uVar12 * 4 + 2] * uVar2) / 0xff);
                  pIVar7[uVar12 * 4 + 3] = (char)((pIVar6[uVar12 * 4 + 3] * uVar2) / 0xff) + bVar1;
                  uVar12 = uVar12 + 1;
                } while (uVar17 != uVar12);
              }
            }
            else if (0 < (int)uVar17) {
              uVar12 = 0;
              do {
                uVar2 = pIVar6[uVar12 * 4 + 3] ^ 0xff;
                pIVar7[uVar12 * 4] =
                     (char)((pIVar7[uVar12 * 4] * uVar2) / 0xff) + pIVar6[uVar12 * 4];
                pIVar7[uVar12 * 4 + 1] =
                     (char)((pIVar7[uVar12 * 4 + 1] * uVar2) / 0xff) + pIVar6[uVar12 * 4 + 1];
                pIVar7[uVar12 * 4 + 2] =
                     (char)((pIVar7[uVar12 * 4 + 2] * uVar2) / 0xff) + pIVar6[uVar12 * 4 + 2];
                pIVar7[uVar12 * 4 + 3] =
                     (char)((pIVar7[uVar12 * 4 + 3] * uVar2) / 0xff) + pIVar6[uVar12 * 4 + 3];
                uVar12 = uVar12 + 1;
              } while (uVar17 != uVar12);
            }
            goto LAB_00113cac;
          }
          pcVar15 = "Encountered invalid color format.";
          type = 0xffffffff;
          level = 1;
          iVar16 = 0x845;
        }
      }
      else if (local_34 == 0x301) {
        if (iVar14 == 0xd000) {
          pcVar15 = "Cannot use Z buffer compositing operation with no Z buffer.";
          type = 0xfffffffb;
          level = 1;
          iVar16 = 0x819;
        }
        else if (iVar14 == 0xd001) {
          pIVar4 = icetImageGetDepthcf(srcBuffer);
          pIVar5 = icetImageGetDepthcf(destBuffer);
          if (iVar16 == 0xc002) {
            pIVar10 = icetImageGetColorf(srcBuffer);
            pIVar11 = icetImageGetColorf(destBuffer);
            if (0 < (int)uVar17) {
              lVar13 = 0;
              do {
                if (*(float *)((long)pIVar4 + lVar13) < *(float *)((long)pIVar5 + lVar13)) {
                  *(float *)((long)pIVar5 + lVar13) = *(float *)((long)pIVar4 + lVar13);
                  pIVar11[lVar13] = pIVar10[lVar13];
                  pIVar11[lVar13 + 1] = pIVar10[lVar13 + 1];
                  pIVar11[lVar13 + 2] = pIVar10[lVar13 + 2];
                  pIVar11[lVar13 + 3] = pIVar10[lVar13 + 3];
                }
                lVar13 = lVar13 + 4;
              } while ((ulong)uVar17 << 2 != lVar13);
            }
            goto LAB_00113cac;
          }
          if (iVar16 == 0xc001) {
            pIVar8 = icetImageGetColorui(srcBuffer);
            pIVar9 = icetImageGetColorui(destBuffer);
            if (0 < (int)uVar17) {
              uVar12 = 0;
              do {
                if ((float)pIVar4[uVar12] < (float)pIVar5[uVar12]) {
                  pIVar5[uVar12] = pIVar4[uVar12];
                  pIVar9[uVar12] = pIVar8[uVar12];
                }
                uVar12 = uVar12 + 1;
              } while (uVar17 != uVar12);
            }
            goto LAB_00113cac;
          }
          if (iVar16 == 0xc000) {
            if (0 < (int)uVar17) {
              uVar12 = 0;
              do {
                if ((float)pIVar4[uVar12] < (float)pIVar5[uVar12]) {
                  pIVar5[uVar12] = pIVar4[uVar12];
                }
                uVar12 = uVar12 + 1;
              } while (uVar17 != uVar12);
            }
            goto LAB_00113cac;
          }
          pcVar15 = "Encountered invalid color format.";
          type = 0xffffffff;
          level = 1;
          iVar16 = 0x815;
        }
        else {
          pcVar15 = "Encountered invalid depth format.";
          type = 0xffffffff;
          level = 1;
          iVar16 = 0x81c;
        }
      }
      else {
        pcVar15 = "Encountered invalid composite mode.";
        type = 0xffffffff;
        level = 1;
        iVar16 = 0x849;
      }
      icetRaiseDiagnostic(pcVar15,type,level,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                          ,iVar16);
LAB_00113cac:
      icetTimingBlendEnd();
      return;
    }
LAB_00113759:
    if (iVar16 == *(int *)((long)srcBuffer.opaque_internals + 4)) {
      iVar3 = *(int *)((long)srcBuffer.opaque_internals + 8);
LAB_00113767:
      if (iVar14 == iVar3) goto LAB_0011376f;
    }
  }
  else {
    iVar16 = *(int *)((long)destBuffer.opaque_internals + 4);
    iVar14 = *(int *)((long)destBuffer.opaque_internals + 8);
    if (srcBuffer.opaque_internals != (IceTVoid *)0x0) goto LAB_00113759;
    if (iVar16 == 0xc000) {
      iVar3 = 0xd000;
      iVar16 = 0xc000;
      goto LAB_00113767;
    }
  }
  pcVar15 = "Source and destination types don\'t match.";
  iVar16 = 0x7eb;
LAB_00113847:
  icetRaiseDiagnostic(pcVar15,0xffffffff,1,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/ice-t/image.c"
                      ,iVar16);
  return;
}

Assistant:

void icetComposite(IceTImage destBuffer, const IceTImage srcBuffer,
                   int srcOnTop)
{
    IceTSizeType pixels;
    IceTSizeType i;
    IceTEnum composite_mode;
    IceTEnum color_format, depth_format;

    pixels = icetImageGetNumPixels(destBuffer);
    if (pixels != icetImageGetNumPixels(srcBuffer)) {
        icetRaiseError("Source and destination sizes don't match.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    color_format = icetImageGetColorFormat(destBuffer);
    depth_format = icetImageGetDepthFormat(destBuffer);

    if (   (color_format != icetImageGetColorFormat(srcBuffer))
        || (depth_format != icetImageGetDepthFormat(srcBuffer)) ) {
        icetRaiseError("Source and destination types don't match.",
                       ICET_SANITY_CHECK_FAIL);
        return;
    }

    icetGetEnumv(ICET_COMPOSITE_MODE, &composite_mode);

    icetTimingBlendBegin();

    if (composite_mode == ICET_COMPOSITE_MODE_Z_BUFFER) {
        if (depth_format == ICET_IMAGE_DEPTH_FLOAT) {
            const IceTFloat *srcDepthBuffer = icetImageGetDepthf(srcBuffer);
            IceTFloat *destDepthBuffer = icetImageGetDepthf(destBuffer);

            if (color_format == ICET_IMAGE_COLOR_RGBA_UBYTE) {
                const IceTUInt *srcColorBuffer=icetImageGetColorui(srcBuffer);
                IceTUInt *destColorBuffer = icetImageGetColorui(destBuffer);
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                        destColorBuffer[i] = srcColorBuffer[i];
                    }
                }
            } else if (color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) {
                const IceTFloat *srcColorBuffer = icetImageGetColorf(srcBuffer);
                IceTFloat *destColorBuffer = icetImageGetColorf(destBuffer);
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                        destColorBuffer[4*i+0] = srcColorBuffer[4*i+0];
                        destColorBuffer[4*i+1] = srcColorBuffer[4*i+1];
                        destColorBuffer[4*i+2] = srcColorBuffer[4*i+2];
                        destColorBuffer[4*i+3] = srcColorBuffer[4*i+3];
                    }
                }
            } else if (color_format == ICET_IMAGE_COLOR_NONE) {
                for (i = 0; i < pixels; i++) {
                    if (srcDepthBuffer[i] < destDepthBuffer[i]) {
                        destDepthBuffer[i] = srcDepthBuffer[i];
                    }
                }
            } else {
                icetRaiseError("Encountered invalid color format.",
                               ICET_SANITY_CHECK_FAIL);
            }
        } else if (depth_format == ICET_IMAGE_DEPTH_NONE) {
            icetRaiseError("Cannot use Z buffer compositing operation with no"
                           " Z buffer.", ICET_INVALID_OPERATION);
        } else {
            icetRaiseError("Encountered invalid depth format.",
                           ICET_SANITY_CHECK_FAIL);
        }
    } else if (composite_mode == ICET_COMPOSITE_MODE_BLEND) {
        if (depth_format != ICET_IMAGE_DEPTH_NONE) {
            icetRaiseWarning("Z buffer ignored during blend composite"
                             " operation.  Output z buffer meaningless.",
                             ICET_INVALID_VALUE);
        }
        if (color_format == ICET_IMAGE_COLOR_RGBA_UBYTE) {
            const IceTUByte *srcColorBuffer = icetImageGetColorcub(srcBuffer);
            IceTUByte *destColorBuffer = icetImageGetColorub(destBuffer);
            if (srcOnTop) {
                for (i = 0; i < pixels; i++) {
                    ICET_OVER_UBYTE(srcColorBuffer + i*4,
                                    destColorBuffer + i*4);
                }
            } else {
                for (i = 0; i < pixels; i++) {
                    ICET_UNDER_UBYTE(srcColorBuffer + i*4,
                                     destColorBuffer + i*4);
                }
            }
        } else if (color_format == ICET_IMAGE_COLOR_RGBA_FLOAT) {
            const IceTFloat *srcColorBuffer = icetImageGetColorcf(srcBuffer);
            IceTFloat *destColorBuffer = icetImageGetColorf(destBuffer);
            if (srcOnTop) {
                for (i = 0; i < pixels; i++) {
                    ICET_OVER_FLOAT(srcColorBuffer + i*4,
                                    destColorBuffer + i*4);
                }
            } else {
                for (i = 0; i < pixels; i++) {
                    ICET_UNDER_FLOAT(srcColorBuffer + i*4,
                                     destColorBuffer + i*4);
                }
            }
        } else if (color_format == ICET_IMAGE_COLOR_NONE) {
            icetRaiseWarning("Compositing image with no data.",
                             ICET_INVALID_OPERATION);
        } else {
            icetRaiseError("Encountered invalid color format.",
                           ICET_SANITY_CHECK_FAIL);
        }
    } else {
        icetRaiseError("Encountered invalid composite mode.",
                       ICET_SANITY_CHECK_FAIL);
    }

    icetTimingBlendEnd();
}